

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

qsizetype findLocaleIndexById(QLocaleId localeId)

{
  undefined2 uVar1;
  undefined2 uVar2;
  long lVar3;
  QLocaleData *pQVar4;
  bool bVar5;
  quint16 qVar6;
  ulong uVar7;
  ulong uVar8;
  QLocaleId other;
  long in_FS_OFFSET;
  QLocaleId localeId_local;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  localeId_local._0_4_ = localeId._0_4_;
  localeId_local.territory_id = localeId.territory_id;
  if (localeId.language_id == 0 || locale_index[(ulong)(uint6)localeId & 0xffff] != 0) {
    uVar7 = (ulong)locale_index[(ulong)(uint6)localeId & 0xffff];
    qVar6 = locale_data[uVar7].m_language_id;
    pQVar4 = locale_data + uVar7;
    do {
      uVar1 = pQVar4->m_script_id;
      uVar2 = pQVar4->m_territory_id;
      other.territory_id = uVar2;
      other.script_id = uVar1;
      other.language_id = qVar6;
      bVar5 = QLocaleId::acceptScriptTerritory(&localeId_local,other);
      uVar8 = uVar7;
      if (bVar5) break;
      uVar7 = uVar7 + 1;
      qVar6 = pQVar4[1].m_language_id;
      bVar5 = qVar6 != 0;
      if (localeId_local.language_id != 0) {
        bVar5 = localeId_local.language_id == qVar6;
      }
      uVar8 = 0xffffffffffffffff;
      pQVar4 = pQVar4 + 1;
    } while (bVar5);
  }
  else {
    uVar8 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return uVar8;
}

Assistant:

static qsizetype findLocaleIndexById(QLocaleId localeId) noexcept
{
    qsizetype idx = locale_index[localeId.language_id];
    // If there are no locales for specified language (so we we've got the
    // default language, which has no associated script or country), give up:
    if (localeId.language_id && idx == 0)
        return idx;

    Q_ASSERT(localeId.acceptLanguage(locale_data[idx].m_language_id));

    do {
        if (localeId.acceptScriptTerritory(locale_data[idx].id()))
            return idx;
        ++idx;
    } while (localeId.acceptLanguage(locale_data[idx].m_language_id));

    return -1;
}